

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer_utils.cc
# Opt level: O2

bool draco::DirectoryExists(string *path_arg)

{
  int iVar1;
  string path;
  stat path_stat;
  char *local_c8 [4];
  stat64 local_a8;
  
  std::__cxx11::string::string((string *)local_c8,(string *)path_arg);
  iVar1 = stat64(local_c8[0],&local_a8);
  std::__cxx11::string::~string((string *)local_c8);
  return (bool)((byte)(local_a8.st_mode >> 0xe) & 1 & iVar1 == 0);
}

Assistant:

bool DirectoryExists(const std::string &path_arg) {
  struct stat path_stat;
  std::string path = path_arg;

#if defined(_WIN32) && not defined(__MINGW32__)
  // Avoid a silly windows issue: stat() will fail on a drive letter missing the
  // trailing slash.
  if (path.size() > 0 && path[path.size()] != '\\' &&
      path[path.size()] != '/') {
    path.append("\\");
  }
#endif

  // Check if |path| exists.
  if (stat(path.c_str(), &path_stat) != 0) {
    return false;
  }

  // Check if |path| is a directory.
  if (path_stat.st_mode & S_IFDIR) {
    return true;
  }
  return false;
}